

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O2

PrimInfo * __thiscall
embree::avx2::PointsISA::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,PointsISA *this,PrimRef *prims,range<unsigned_long> *r,
          size_t k,uint geomID)

{
  BufferView<embree::Vec3fx> *pBVar1;
  char *pcVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  float fVar5;
  PrimInfo *pinfo;
  size_t sVar6;
  size_t sVar7;
  undefined4 uVar8;
  long lVar9;
  uint index;
  unsigned_long uVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar13 [64];
  undefined1 auVar15 [64];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar10 = r->_begin;
  auVar14._8_4_ = 0x7f800000;
  auVar14._0_8_ = 0x7f8000007f800000;
  auVar14._12_4_ = 0x7f800000;
  auVar15 = ZEXT1664(auVar14);
  auVar12._8_4_ = 0xff800000;
  auVar12._0_8_ = 0xff800000ff800000;
  auVar12._12_4_ = 0xff800000;
  auVar13 = ZEXT1664(auVar12);
  sVar6 = 0;
  auVar16._8_4_ = 0xddccb9a2;
  auVar16._0_8_ = 0xddccb9a2ddccb9a2;
  auVar16._12_4_ = 0xddccb9a2;
  auVar17._8_4_ = 0x5dccb9a2;
  auVar17._0_8_ = 0x5dccb9a25dccb9a2;
  auVar17._12_4_ = 0x5dccb9a2;
  auVar18 = ZEXT1664(auVar12);
  auVar19 = ZEXT1664(auVar14);
  while( true ) {
    if (r->_end <= uVar10) break;
    pBVar1 = (this->super_Points).vertices.items;
    sVar7 = k;
    if ((uVar10 & 0xffffffff) < (pBVar1->super_RawBufferView).num) {
      lVar9 = (uVar10 & 0xffffffff) * (pBVar1->super_RawBufferView).stride;
      pcVar2 = (pBVar1->super_RawBufferView).ptr_ofs;
      if (0.0 <= *(float *)(pcVar2 + lVar9 + 0xc)) {
        auVar12 = *(undefined1 (*) [16])(pcVar2 + lVar9);
        auVar14 = vcmpps_avx(auVar12,auVar16,2);
        auVar12 = vcmpps_avx(auVar12,auVar17,5);
        auVar12 = vorps_avx(auVar14,auVar12);
        uVar8 = vmovmskps_avx(auVar12);
        if ((char)uVar8 == '\0') {
          lVar9 = *(long *)&(this->super_Points).super_Geometry.field_0x58;
          lVar11 = *(long *)&(this->super_Points).field_0x68 * uVar10;
          auVar12 = *(undefined1 (*) [16])(lVar9 + lVar11);
          fVar5 = *(float *)(lVar9 + 0xc + lVar11) * (this->super_Points).maxRadiusScale;
          auVar21._4_4_ = fVar5;
          auVar21._0_4_ = fVar5;
          auVar21._8_4_ = fVar5;
          auVar21._12_4_ = fVar5;
          auVar14 = vsubps_avx(auVar12,auVar21);
          aVar3 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                  vinsertps_avx(auVar14,ZEXT416(geomID),0x30);
          auVar20._0_4_ = auVar12._0_4_ + fVar5;
          auVar20._4_4_ = auVar12._4_4_ + fVar5;
          auVar20._8_4_ = auVar12._8_4_ + fVar5;
          auVar20._12_4_ = auVar12._12_4_ + fVar5;
          aVar4 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                  vinsertps_avx(auVar20,ZEXT416((uint)uVar10),0x30);
          auVar12 = vminps_avx((undefined1  [16])auVar19._0_16_,(undefined1  [16])aVar3);
          auVar19 = ZEXT1664(auVar12);
          auVar12 = vmaxps_avx((undefined1  [16])auVar18._0_16_,(undefined1  [16])aVar4);
          auVar18 = ZEXT1664(auVar12);
          auVar22._0_4_ = aVar3.x + aVar4.x;
          auVar22._4_4_ = aVar3.y + aVar4.y;
          auVar22._8_4_ = aVar3.z + aVar4.z;
          auVar22._12_4_ = aVar3.field_3.w + aVar4.field_3.w;
          auVar12 = vminps_avx((undefined1  [16])auVar15._0_16_,auVar22);
          auVar15 = ZEXT1664(auVar12);
          auVar12 = vmaxps_avx((undefined1  [16])auVar13._0_16_,auVar22);
          auVar13 = ZEXT1664(auVar12);
          sVar6 = sVar6 + 1;
          sVar7 = k + 1;
          prims[k].upper.field_0.field_1 = aVar4;
          prims[k].lower.field_0.field_1 = aVar3;
        }
      }
    }
    uVar10 = uVar10 + 1;
    k = sVar7;
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       auVar19._0_16_;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       auVar18._0_16_;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       auVar15._0_16_;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       auVar13._0_16_;
  __return_storage_ptr__->end = sVar6;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j = r.begin(); j < r.end(); j++) {
          BBox3fa bounds = empty;
          if (!buildBounds(j, &bounds))
            continue;
          const PrimRef prim(bounds, geomID, unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }